

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimizer.cpp
# Opt level: O2

bool __thiscall
spvtools::Optimizer::Run
          (Optimizer *this,uint32_t *original_binary,size_t original_binary_size,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *optimized_binary,
          spv_optimizer_options opt_options)

{
  spv_target_env env;
  _Head_base<0UL,_spvtools::Optimizer::Impl_*,_false> _Var1;
  pointer puVar2;
  bool bVar3;
  Status SVar4;
  int iVar5;
  unique_ptr<spvtools::opt::IRContext,_std::default_delete<spvtools::opt::IRContext>_> context;
  SpirvTools tools;
  vector<unsigned_int,_std::allocator<unsigned_int>_> optimized_binary_with_nop;
  _Any_data local_70;
  code *local_60;
  _Any_data local_50;
  code *local_40;
  
  SpirvTools::SpirvTools
            (&tools,((this->impl_)._M_t.
                     super___uniq_ptr_impl<spvtools::Optimizer::Impl,_std::default_delete<spvtools::Optimizer::Impl>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_spvtools::Optimizer::Impl_*,_std::default_delete<spvtools::Optimizer::Impl>_>
                     .super__Head_base<0UL,_spvtools::Optimizer::Impl_*,_false>._M_head_impl)->
                    target_env);
  std::function<void_(spv_message_level_t,_const_char_*,_const_spv_position_t_&,_const_char_*)>::
  function((function<void_(spv_message_level_t,_const_char_*,_const_spv_position_t_&,_const_char_*)>
            *)&local_50,
           &(((this->impl_)._M_t.
              super___uniq_ptr_impl<spvtools::Optimizer::Impl,_std::default_delete<spvtools::Optimizer::Impl>_>
              ._M_t.
              super__Tuple_impl<0UL,_spvtools::Optimizer::Impl_*,_std::default_delete<spvtools::Optimizer::Impl>_>
              .super__Head_base<0UL,_spvtools::Optimizer::Impl_*,_false>._M_head_impl)->pass_manager
            ).consumer_);
  SpirvTools::SetMessageConsumer(&tools,(MessageConsumer *)&local_50);
  if (local_40 != (code *)0x0) {
    (*local_40)(&local_50,&local_50,__destroy_functor);
  }
  if (opt_options->run_validator_ == true) {
    bVar3 = SpirvTools::Validate
                      (&tools,original_binary,original_binary_size,&opt_options->val_options_);
    if (!bVar3) {
      bVar3 = false;
      goto LAB_0044c671;
    }
  }
  _Var1._M_head_impl =
       (this->impl_)._M_t.
       super___uniq_ptr_impl<spvtools::Optimizer::Impl,_std::default_delete<spvtools::Optimizer::Impl>_>
       ._M_t.
       super__Tuple_impl<0UL,_spvtools::Optimizer::Impl_*,_std::default_delete<spvtools::Optimizer::Impl>_>
       .super__Head_base<0UL,_spvtools::Optimizer::Impl_*,_false>._M_head_impl;
  env = (_Var1._M_head_impl)->target_env;
  std::function<void_(spv_message_level_t,_const_char_*,_const_spv_position_t_&,_const_char_*)>::
  function((function<void_(spv_message_level_t,_const_char_*,_const_spv_position_t_&,_const_char_*)>
            *)&local_70,&((_Var1._M_head_impl)->pass_manager).consumer_);
  BuildModule((spvtools *)&context,env,(MessageConsumer *)&local_70,original_binary,
              original_binary_size);
  if (local_60 != (code *)0x0) {
    (*local_60)(&local_70,&local_70,__destroy_functor);
  }
  if ((__uniq_ptr_impl<spvtools::opt::IRContext,_std::default_delete<spvtools::opt::IRContext>_>)
      context._M_t.
      super___uniq_ptr_impl<spvtools::opt::IRContext,_std::default_delete<spvtools::opt::IRContext>_>
      ._M_t.
      super__Tuple_impl<0UL,_spvtools::opt::IRContext_*,_std::default_delete<spvtools::opt::IRContext>_>
      .super__Head_base<0UL,_spvtools::opt::IRContext_*,_false>._M_head_impl ==
      (__uniq_ptr_impl<spvtools::opt::IRContext,_std::default_delete<spvtools::opt::IRContext>_>)0x0
     ) {
LAB_0044c661:
    bVar3 = false;
  }
  else {
    *(uint32_t *)
     ((long)context._M_t.
            super___uniq_ptr_impl<spvtools::opt::IRContext,_std::default_delete<spvtools::opt::IRContext>_>
            ._M_t.
            super__Tuple_impl<0UL,_spvtools::opt::IRContext_*,_std::default_delete<spvtools::opt::IRContext>_>
            .super__Head_base<0UL,_spvtools::opt::IRContext_*,_false>._M_head_impl + 0x248) =
         opt_options->max_id_bound_;
    *(bool *)((long)context._M_t.
                    super___uniq_ptr_impl<spvtools::opt::IRContext,_std::default_delete<spvtools::opt::IRContext>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_spvtools::opt::IRContext_*,_std::default_delete<spvtools::opt::IRContext>_>
                    .super__Head_base<0UL,_spvtools::opt::IRContext_*,_false>._M_head_impl + 0x24c)
         = opt_options->preserve_bindings_;
    *(bool *)((long)context._M_t.
                    super___uniq_ptr_impl<spvtools::opt::IRContext,_std::default_delete<spvtools::opt::IRContext>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_spvtools::opt::IRContext_*,_std::default_delete<spvtools::opt::IRContext>_>
                    .super__Head_base<0UL,_spvtools::opt::IRContext_*,_false>._M_head_impl + 0x24d)
         = opt_options->preserve_spec_constants_;
    *(spv_validator_options_t **)
     ((long)&((this->impl_)._M_t.
              super___uniq_ptr_impl<spvtools::Optimizer::Impl,_std::default_delete<spvtools::Optimizer::Impl>_>
              ._M_t.
              super__Tuple_impl<0UL,_spvtools::Optimizer::Impl_*,_std::default_delete<spvtools::Optimizer::Impl>_>
              .super__Head_base<0UL,_spvtools::Optimizer::Impl_*,_false>._M_head_impl)->pass_manager
     + 0x50) = &opt_options->val_options_;
    _Var1._M_head_impl =
         (this->impl_)._M_t.
         super___uniq_ptr_impl<spvtools::Optimizer::Impl,_std::default_delete<spvtools::Optimizer::Impl>_>
         ._M_t.
         super__Tuple_impl<0UL,_spvtools::Optimizer::Impl_*,_std::default_delete<spvtools::Optimizer::Impl>_>
         .super__Head_base<0UL,_spvtools::Optimizer::Impl_*,_false>._M_head_impl;
    *(spv_target_env *)((long)&(_Var1._M_head_impl)->pass_manager + 0x48) =
         (_Var1._M_head_impl)->target_env;
    SVar4 = opt::PassManager::Run
                      (&(_Var1._M_head_impl)->pass_manager,
                       (IRContext *)
                       context._M_t.
                       super___uniq_ptr_impl<spvtools::opt::IRContext,_std::default_delete<spvtools::opt::IRContext>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_spvtools::opt::IRContext_*,_std::default_delete<spvtools::opt::IRContext>_>
                       .super__Head_base<0UL,_spvtools::opt::IRContext_*,_false>._M_head_impl);
    if (SVar4 == Failure) goto LAB_0044c661;
    if ((SVar4 == SuccessWithoutChange) &&
       ((*(Module **)
          ((long)context._M_t.
                 super___uniq_ptr_impl<spvtools::opt::IRContext,_std::default_delete<spvtools::opt::IRContext>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_spvtools::opt::IRContext_*,_std::default_delete<spvtools::opt::IRContext>_>
                 .super__Head_base<0UL,_spvtools::opt::IRContext_*,_false>._M_head_impl + 0x30))->
        contains_debug_info_ == false)) {
      optimized_binary_with_nop.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      optimized_binary_with_nop.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      optimized_binary_with_nop.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      opt::Module::ToBinary
                (*(Module **)
                  ((long)context._M_t.
                         super___uniq_ptr_impl<spvtools::opt::IRContext,_std::default_delete<spvtools::opt::IRContext>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_spvtools::opt::IRContext_*,_std::default_delete<spvtools::opt::IRContext>_>
                         .super__Head_base<0UL,_spvtools::opt::IRContext_*,_false>._M_head_impl +
                  0x30),&optimized_binary_with_nop,false);
      if ((long)optimized_binary_with_nop.
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)optimized_binary_with_nop.
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start >> 2 != original_binary_size) {
        __assert_fail("optimized_binary_with_nop.size() == original_binary_size && \"Binary size unexpectedly changed despite the optimizer saying \" \"there was no change\""
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/optimizer.cpp"
                      ,0x2cb,
                      "bool spvtools::Optimizer::Run(const uint32_t *, const size_t, std::vector<uint32_t> *, const spv_optimizer_options) const"
                     );
      }
      if (*optimized_binary_with_nop.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
           ._M_impl.super__Vector_impl_data._M_start == *original_binary) {
        iVar5 = bcmp(optimized_binary_with_nop.
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_start,original_binary,original_binary_size);
        if (iVar5 != 0) {
          __assert_fail("memcmp(optimized_binary_with_nop.data(), original_binary, original_binary_size) == 0 && \"Binary content unexpectedly changed despite the optimizer saying \" \"there was no change\""
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/optimizer.cpp"
                        ,0x2d4,
                        "bool spvtools::Optimizer::Run(const uint32_t *, const size_t, std::vector<uint32_t> *, const spv_optimizer_options) const"
                       );
        }
      }
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                (&optimized_binary_with_nop.
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
    }
    puVar2 = (optimized_binary->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
             _M_impl.super__Vector_impl_data._M_start;
    if ((optimized_binary->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
        super__Vector_impl_data._M_finish != puVar2) {
      (optimized_binary->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_finish = puVar2;
    }
    opt::Module::ToBinary
              (*(Module **)
                ((long)context._M_t.
                       super___uniq_ptr_impl<spvtools::opt::IRContext,_std::default_delete<spvtools::opt::IRContext>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_spvtools::opt::IRContext_*,_std::default_delete<spvtools::opt::IRContext>_>
                       .super__Head_base<0UL,_spvtools::opt::IRContext_*,_false>._M_head_impl + 0x30
                ),optimized_binary,true);
    bVar3 = true;
  }
  std::unique_ptr<spvtools::opt::IRContext,_std::default_delete<spvtools::opt::IRContext>_>::
  ~unique_ptr(&context);
LAB_0044c671:
  SpirvTools::~SpirvTools(&tools);
  return bVar3;
}

Assistant:

bool Optimizer::Run(const uint32_t* original_binary,
                    const size_t original_binary_size,
                    std::vector<uint32_t>* optimized_binary,
                    const spv_optimizer_options opt_options) const {
  spvtools::SpirvTools tools(impl_->target_env);
  tools.SetMessageConsumer(impl_->pass_manager.consumer());
  if (opt_options->run_validator_ &&
      !tools.Validate(original_binary, original_binary_size,
                      &opt_options->val_options_)) {
    return false;
  }

  std::unique_ptr<opt::IRContext> context = BuildModule(
      impl_->target_env, consumer(), original_binary, original_binary_size);
  if (context == nullptr) return false;

  context->set_max_id_bound(opt_options->max_id_bound_);
  context->set_preserve_bindings(opt_options->preserve_bindings_);
  context->set_preserve_spec_constants(opt_options->preserve_spec_constants_);

  impl_->pass_manager.SetValidatorOptions(&opt_options->val_options_);
  impl_->pass_manager.SetTargetEnv(impl_->target_env);
  auto status = impl_->pass_manager.Run(context.get());

  if (status == opt::Pass::Status::Failure) {
    return false;
  }

#ifndef NDEBUG
  // We do not keep the result id of DebugScope in struct DebugScope.
  // Instead, we assign random ids for them, which results in integrity
  // check failures. In addition, propagating the OpLine/OpNoLine to preserve
  // the debug information through transformations results in integrity
  // check failures. We want to skip the integrity check when the module
  // contains DebugScope or OpLine/OpNoLine instructions.
  if (status == opt::Pass::Status::SuccessWithoutChange &&
      !context->module()->ContainsDebugInfo()) {
    std::vector<uint32_t> optimized_binary_with_nop;
    context->module()->ToBinary(&optimized_binary_with_nop,
                                /* skip_nop = */ false);
    assert(optimized_binary_with_nop.size() == original_binary_size &&
           "Binary size unexpectedly changed despite the optimizer saying "
           "there was no change");

    // Compare the magic number to make sure the binaries were encoded in the
    // endianness.  If not, the contents of the binaries will be different, so
    // do not check the contents.
    if (optimized_binary_with_nop[0] == original_binary[0]) {
      assert(memcmp(optimized_binary_with_nop.data(), original_binary,
                    original_binary_size) == 0 &&
             "Binary content unexpectedly changed despite the optimizer saying "
             "there was no change");
    }
  }
#endif  // !NDEBUG

  // Note that |original_binary| and |optimized_binary| may share the same
  // buffer and the below will invalidate |original_binary|.
  optimized_binary->clear();
  context->module()->ToBinary(optimized_binary, /* skip_nop = */ true);

  return true;
}